

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void pegmatite::_syntax_Error(ErrorReporter *err,Context *con)

{
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  ParserPosition local_60;
  InputRange local_48;
  Context *local_18;
  Context *con_local;
  ErrorReporter *err_local;
  
  local_18 = con;
  con_local = (Context *)err;
  _next_pos(&local_60,&con->error_pos);
  InputRange::InputRange(&local_48,&con->error_pos,&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"syntax error",&local_81);
  std::
  function<void_(const_pegmatite::InputRange_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(err,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  return;
}

Assistant:

static void _syntax_Error(ErrorReporter &err, Context &con)
{
	err(InputRange(con.error_pos, _next_pos(con.error_pos)), "syntax error");
}